

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

void ctemplate_htmlparser::exit_attr(statemachine_ctx *ctx,int start,char chr,int end)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  byte bVar4;
  int iVar5;
  char *__src;
  size_t __n;
  byte *pbVar6;
  
  pvVar2 = ctx->user;
  if (pvVar2 != (void *)0x0) {
    __src = statemachine_stop_record(ctx);
    sVar3 = ctx->record_pos;
    uVar1 = sVar3 + 1;
    __n = 0x100;
    if (uVar1 < 0x100) {
      __n = uVar1;
    }
    strncpy((char *)((long)pvVar2 + 0x128),__src,__n);
    if (sVar3 != 0xffffffffffffffff) {
      *(undefined1 *)((long)pvVar2 + __n + 0x127) = 0;
    }
    bVar4 = *(byte *)((long)pvVar2 + 0x128);
    if (bVar4 != 0) {
      pbVar6 = (byte *)((long)pvVar2 + 0x129);
      do {
        iVar5 = tolower((uint)bVar4);
        pbVar6[-1] = (byte)iVar5;
        bVar4 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar4 != 0);
    }
    return;
  }
  __assert_fail("html != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x1f2,"void ctemplate_htmlparser::exit_attr(statemachine_ctx *, int, char, int)");
}

Assistant:

static void exit_attr(statemachine_ctx *ctx, int start, char chr, int end)
{
    htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
    assert(html != NULL);

    nopad_strncpy(html->attr, statemachine_stop_record(ctx),
                  HTMLPARSER_MAX_STRING, statemachine_record_length(ctx));

    tolower_str(html->attr);
}